

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall S2Builder::S2Builder(S2Builder *this,Options *options)

{
  Options *options_local;
  S2Builder *this_local;
  
  Options::Options(&this->options_);
  S1ChordAngle::S1ChordAngle(&this->site_snap_radius_ca_);
  S1ChordAngle::S1ChordAngle(&this->edge_snap_radius_ca_);
  S1Angle::S1Angle(&this->max_edge_deviation_);
  S1ChordAngle::S1ChordAngle(&this->edge_site_query_radius_ca_);
  S1ChordAngle::S1ChordAngle(&this->min_edge_length_to_split_ca_);
  S1Angle::S1Angle(&this->min_site_separation_);
  S1ChordAngle::S1ChordAngle(&this->min_site_separation_ca_);
  S1ChordAngle::S1ChordAngle(&this->min_edge_site_separation_ca_);
  S1ChordAngle::S1ChordAngle(&this->min_edge_site_separation_ca_limit_);
  S1ChordAngle::S1ChordAngle(&this->max_adjacent_site_separation_ca_);
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::vector(&this->input_vertices_);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&this->input_edges_);
  std::
  vector<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
  ::vector(&this->layers_);
  std::vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>::vector
            (&this->layer_options_);
  std::vector<int,_std::allocator<int>_>::vector(&this->layer_begins_);
  std::
  vector<std::function<bool_(const_S2Builder::Graph_&,_S2Error_*)>,_std::allocator<std::function<bool_(const_S2Builder::Graph_&,_S2Error_*)>_>_>
  ::vector(&this->layer_is_full_polygon_predicates_);
  std::vector<int,_std::allocator<int>_>::vector(&this->label_set_ids_);
  IdSetLexicon::IdSetLexicon(&this->label_set_lexicon_);
  std::vector<int,_std::allocator<int>_>::vector(&this->label_set_);
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::vector(&this->sites_);
  std::
  vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  ::vector(&this->edge_sites_);
  Init(this,options);
  return;
}

Assistant:

S2Builder::S2Builder(const Options& options) {
  Init(options);
}